

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

void strskip(char *s,char c,char e)

{
  bool bVar1;
  char *pcStack_28;
  _Bool escapeseen;
  char *out;
  char *in;
  char e_local;
  char c_local;
  char *s_local;
  
  bVar1 = false;
  pcStack_28 = s;
  for (out = s; *out != '\0'; out = out + 1) {
    if ((*out == c) || ((*out == e && (!bVar1)))) {
      if (*out == e) {
        bVar1 = true;
      }
      else if (bVar1) {
        *pcStack_28 = *out;
        pcStack_28 = pcStack_28 + 1;
        bVar1 = false;
      }
    }
    else {
      if (bVar1) {
        *pcStack_28 = e;
        pcStack_28 = pcStack_28 + 1;
      }
      *pcStack_28 = *out;
      pcStack_28 = pcStack_28 + 1;
      bVar1 = false;
    }
  }
  *pcStack_28 = '\0';
  return;
}

Assistant:

void strskip(char *s, const char c, const char e) {
	char *in = s;
	char *out = s;
	bool escapeseen = false;
	while (*in) {
		if ((*in != c) && ((*in != e) || escapeseen)) {
			if (escapeseen) {
				/* Not escaping anything */
				*out = e;
				out++;
			}
			*out = *in;
			out++;
			escapeseen = false;
		} else if (*in == e) {
			/* Maybe escaping something */
			escapeseen = true;
		} else if (escapeseen) {
			/* Add the escaped character */
			*out = *in;
			out++;
			escapeseen = false;
		}
		in++;
	}
	*out = 0;
}